

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

void printReads(ostream *outfile,deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *reads
               ,int doc_haplotypes)

{
  int iVar1;
  pointer pbVar2;
  _Elt_pointer ppAVar3;
  AlignmentRecord *pAVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer pbVar6;
  _Elt_pointer ppAVar7;
  pointer pbVar8;
  pointer pbVar9;
  char *pcVar10;
  bool bVar11;
  pointer pbVar12;
  int iVar13;
  int iVar14;
  _Map_pointer pppAVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  AlignmentRecord **r;
  _Elt_pointer ppAVar21;
  _Elt_pointer local_108;
  _Map_pointer local_100;
  _Map_pointer local_f8;
  pointer local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  _Map_pointer local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  _Map_pointer local_b0;
  _Map_pointer local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  _Map_pointer local_80;
  pointer local_78;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  _Map_pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  _Map_pointer local_38;
  
  pbVar6 = (pointer)(reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
                    )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar8 = (pointer)(reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
                    )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar6 != pbVar8) {
    pbVar12 = (pointer)(reads->
                       super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_first;
    pbVar9 = (pointer)(reads->
                      super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last;
    pppAVar15 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_node;
    pbVar2 = (pointer)(reads->
                      super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_first;
    local_78 = (pointer)(reads->
                        super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_last;
    local_a0 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar19 = ((long)pbVar9 - (long)pbVar6 >> 3) + ((long)pbVar8 - (long)pbVar2 >> 3) +
             ((((ulong)((long)local_a0 - (long)pppAVar15) >> 3) - 1) +
             (ulong)(local_a0 == (_Map_pointer)0x0)) * 0x40;
    lVar20 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar20 == 0; lVar20 = lVar20 + -1) {
      }
    }
    local_70 = pbVar8;
    local_68 = pbVar2;
    local_60 = local_78;
    local_58 = local_a0;
    local_50 = pbVar6;
    local_48 = pbVar12;
    local_40 = pbVar9;
    local_38 = pppAVar15;
    std::
    __introsort_loop<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,long,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
              (&local_50,&local_70,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar19 < 0x11) {
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
      local_d0 = local_a0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar8;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar6;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
      local_80 = pppAVar15;
      std::
      __insertion_sort<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
                ();
    }
    else {
      lVar20 = (long)pbVar6 - (long)pbVar12 >> 3;
      uVar19 = lVar20 + 0x10;
      if (uVar19 < 0x40) {
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar6 + 4;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
        local_b0 = pppAVar15;
      }
      else {
        uVar5 = uVar19 >> 6 | 0xfc00000000000000;
        if (-0x10 < lVar20) {
          uVar5 = uVar19 >> 6;
        }
        local_b0 = pppAVar15 + uVar5;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*local_b0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 0x10;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(&local_c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[uVar5 * -0x10 + 4]._M_dataplus +
                      lVar20);
      }
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar6;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
      local_d0 = pppAVar15;
      std::
      __insertion_sort<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
                (&local_e8);
      if (uVar19 < 0x40) {
        pbVar6 = pbVar6 + 4;
      }
      else {
        uVar5 = uVar19 >> 6 | 0xfc00000000000000;
        if (-0x10 < lVar20) {
          uVar5 = uVar19 >> 6;
        }
        pppAVar15 = pppAVar15 + uVar5;
        pbVar12 = (pointer)*pppAVar15;
        pbVar9 = pbVar12 + 0x10;
        pbVar6 = (pointer)(&pbVar12[uVar5 * -0x10 + 4]._M_dataplus + lVar20);
      }
      if (pbVar6 != pbVar8) {
        do {
          local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar6;
          local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
          local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
          local_80 = pppAVar15;
          std::
          __unguarded_linear_insert<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Val_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
                    (&local_98);
          pbVar6 = (pointer)&pbVar6->_M_string_length;
          if (pbVar6 == pbVar9) {
            pbVar6 = (pointer)pppAVar15[1];
            pppAVar15 = pppAVar15 + 1;
            pbVar9 = pbVar6 + 0x10;
            pbVar12 = pbVar6;
          }
        } while (pbVar6 != pbVar8);
      }
    }
  }
  lVar20 = *(long *)outfile;
  *(undefined8 *)(outfile + *(long *)(lVar20 + -0x18) + 8) = 5;
  lVar20 = *(long *)(lVar20 + -0x18);
  *(uint *)(outfile + lVar20 + 0x18) = *(uint *)(outfile + lVar20 + 0x18) & 0xfffffefb | 4;
  bVar11 = SUB81(outfile,0);
  if (doc_haplotypes == 5) {
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar6 = (pointer)(reads->
                      super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_78 = (pointer)(reads->
                        super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar6 != local_78) {
      local_f0 = (pointer)(reads->
                          super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_last;
      local_a0 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        AlignmentRecord::getReadNames_abi_cxx11_
                  (&local_c8,(AlignmentRecord *)(pbVar6->_M_dataplus)._M_p);
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,">",1);
        pAVar4 = (AlignmentRecord *)(pbVar6->_M_dataplus)._M_p;
        std::__ostream_insert<char,std::char_traits<char>>
                  (outfile,(pAVar4->name)._M_dataplus._M_p,(pAVar4->name)._M_string_length);
        pAVar4 = (AlignmentRecord *)(pbVar6->_M_dataplus)._M_p;
        if (pAVar4->single_end == true) {
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
          std::ostream::_M_insert<double>
                    (((AlignmentRecord *)(pbVar6->_M_dataplus)._M_p)->probability);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
LAB_00174d9a:
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        }
        else {
          uVar16 = pAVar4->end1 + 1;
          if (uVar16 < pAVar4->start2) {
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|paired",7);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
            std::ostream::_M_insert<double>
                      (((AlignmentRecord *)(pbVar6->_M_dataplus)._M_p)->probability);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start2:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            pcVar10 = "|end2:";
LAB_00174d87:
            std::__ostream_insert<char,std::char_traits<char>>(outfile,pcVar10,6);
            goto LAB_00174d9a;
          }
          if (uVar16 == pAVar4->start2) {
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
            std::ostream::_M_insert<double>
                      (((AlignmentRecord *)(pbVar6->_M_dataplus)._M_p)->probability);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            pcVar10 = "|end1:";
            goto LAB_00174d87;
          }
        }
        pbVar8 = local_e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar13 = 0;
          iVar17 = 0;
          iVar1 = 0;
          iVar18 = 0;
          iVar14 = 0;
        }
        else {
          iVar14 = 0;
          iVar18 = 0;
          iVar1 = 0;
          iVar17 = 0;
          iVar13 = 0;
          pbVar9 = local_e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            lVar20 = std::__cxx11::string::find((char *)pbVar9,0x19b539,0);
            if (lVar20 == -1) {
              lVar20 = std::__cxx11::string::find((char *)pbVar9,0x19b541,0);
              if (lVar20 == -1) {
                lVar20 = std::__cxx11::string::find((char *)pbVar9,0x19b549,0);
                if (lVar20 == -1) {
                  lVar20 = std::__cxx11::string::find((char *)pbVar9,0x19b551,0);
                  if (lVar20 == -1) {
                    lVar20 = std::__cxx11::string::find((char *)pbVar9,0x19b559,0);
                    iVar1 = iVar1 + (uint)(lVar20 != -1);
                  }
                  else {
                    iVar17 = iVar17 + 1;
                  }
                }
                else {
                  iVar13 = iVar13 + 1;
                }
              }
              else {
                iVar18 = iVar18 + 1;
              }
            }
            else {
              iVar14 = iVar14 + 1;
            }
            pbVar9 = pbVar9 + 1;
          } while (pbVar9 != pbVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht1:",5);
        std::ostream::operator<<((ostream *)outfile,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht2:",5);
        std::ostream::operator<<((ostream *)outfile,iVar18);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht3:",5);
        std::ostream::operator<<((ostream *)outfile,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht4:",5);
        std::ostream::operator<<((ostream *)outfile,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht5:",5);
        std::ostream::operator<<((ostream *)outfile,iVar1);
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar11);
        std::ostream::put(bVar11);
        std::ostream::flush();
        operator<<(outfile,&((AlignmentRecord *)(pbVar6->_M_dataplus)._M_p)->sequence1);
        pAVar4 = (AlignmentRecord *)(pbVar6->_M_dataplus)._M_p;
        if (pAVar4->single_end == false) {
          uVar16 = pAVar4->end1;
          while( true ) {
            uVar16 = uVar16 + 1;
            pAVar4 = (AlignmentRecord *)(pbVar6->_M_dataplus)._M_p;
            if (pAVar4->start2 <= uVar16) break;
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"N",1);
          }
          operator<<(outfile,&pAVar4->sequence2);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar11);
        std::ostream::put(bVar11);
        std::ostream::flush();
        pbVar6 = (pointer)&pbVar6->_M_string_length;
        if (pbVar6 == local_f0) {
          pbVar6 = (pointer)local_a0[1];
          local_a0 = local_a0 + 1;
          local_f0 = pbVar6 + 0x10;
        }
      } while (pbVar6 != local_78);
    }
  }
  else {
    if (doc_haplotypes != 2) {
      if (doc_haplotypes != 0) {
        return;
      }
      ppAVar21 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppAVar3 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppAVar21 == ppAVar3) {
        return;
      }
      ppAVar7 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      local_100 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        AlignmentRecord::getReadNames_abi_cxx11_(&local_98,*ppAVar21);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (outfile,((*ppAVar21)->name)._M_dataplus._M_p,((*ppAVar21)->name)._M_string_length
                  );
        if ((*ppAVar21)->single_end == false) {
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|paired",7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
        std::ostream::_M_insert<double>((*ppAVar21)->probability);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
        std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
        std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        if ((*ppAVar21)->single_end == false) {
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start2:",8);
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end2:",6);
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        }
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|#reads:",8);
        std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|#strand:",9);
        std::ostream::_M_insert<bool>(bVar11);
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar11);
        std::ostream::put(bVar11);
        std::ostream::flush();
        operator<<(outfile,&(*ppAVar21)->sequence1);
        if ((*ppAVar21)->single_end == false) {
          uVar16 = (*ppAVar21)->end1;
          while( true ) {
            uVar16 = uVar16 + 1;
            if ((*ppAVar21)->start2 <= uVar16) break;
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"N",1);
          }
          operator<<(outfile,&(*ppAVar21)->sequence2);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar11);
        std::ostream::put(bVar11);
        std::ostream::flush();
        ppAVar21 = ppAVar21 + 1;
        if (ppAVar21 == ppAVar7) {
          ppAVar21 = local_100[1];
          local_100 = local_100 + 1;
          ppAVar7 = ppAVar21 + 0x40;
        }
      } while (ppAVar21 != ppAVar3);
      return;
    }
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppAVar21 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppAVar3 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppAVar21 != ppAVar3) {
      local_108 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_last;
      local_f8 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        AlignmentRecord::getReadNames_abi_cxx11_(&local_c8,*ppAVar21);
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (outfile,((*ppAVar21)->name)._M_dataplus._M_p,((*ppAVar21)->name)._M_string_length
                  );
        pAVar4 = *ppAVar21;
        if (pAVar4->single_end == true) {
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
          std::ostream::_M_insert<double>((*ppAVar21)->probability);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
          std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
LAB_001749a9:
          std::ostream::_M_insert<unsigned_long>((ulong)outfile);
        }
        else {
          uVar16 = pAVar4->end1 + 1;
          if (uVar16 < pAVar4->start2) {
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|paired",7);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
            std::ostream::_M_insert<double>((*ppAVar21)->probability);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|end1:",6);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start2:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            pcVar10 = "|end2:";
LAB_00174996:
            std::__ostream_insert<char,std::char_traits<char>>(outfile,pcVar10,6);
            goto LAB_001749a9;
          }
          if (uVar16 == pAVar4->start2) {
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht_freq:",9);
            std::ostream::_M_insert<double>((*ppAVar21)->probability);
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"|start1:",8);
            std::ostream::_M_insert<unsigned_long>((ulong)outfile);
            pcVar10 = "|end1:";
            goto LAB_00174996;
          }
        }
        pbVar6 = local_e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar17 = 0;
          iVar13 = 0;
        }
        else {
          iVar13 = 0;
          iVar17 = 0;
          pbVar8 = local_e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            lVar20 = std::__cxx11::string::find((char *)pbVar8,0x19b57f,0);
            if (lVar20 == -1) {
              lVar20 = std::__cxx11::string::find((char *)pbVar8,0x19b586,0);
              iVar13 = iVar13 + (uint)(lVar20 != -1);
            }
            else {
              iVar17 = iVar17 + 1;
            }
            pbVar8 = pbVar8 + 1;
          } while (pbVar8 != pbVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht1:",5);
        std::ostream::operator<<((ostream *)outfile,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>(outfile,"|ht2:",5);
        std::ostream::operator<<((ostream *)outfile,iVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar11);
        std::ostream::put(bVar11);
        std::ostream::flush();
        operator<<(outfile,&(*ppAVar21)->sequence1);
        if ((*ppAVar21)->single_end == false) {
          uVar16 = (*ppAVar21)->end1;
          while( true ) {
            uVar16 = uVar16 + 1;
            if ((*ppAVar21)->start2 <= uVar16) break;
            std::__ostream_insert<char,std::char_traits<char>>(outfile,"N",1);
          }
          operator<<(outfile,&(*ppAVar21)->sequence2);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + bVar11);
        std::ostream::put(bVar11);
        std::ostream::flush();
        ppAVar21 = ppAVar21 + 1;
        if (ppAVar21 == local_108) {
          ppAVar21 = local_f8[1];
          local_f8 = local_f8 + 1;
          local_108 = ppAVar21 + 0x40;
        }
      } while (ppAVar21 != ppAVar3);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

void printReads(std::ostream& outfile, std::deque<AlignmentRecord*>& reads, int doc_haplotypes) {
    auto comp = [](AlignmentRecord* al1, AlignmentRecord* al2) { return al1->probability > al2->probability; };
    std::sort(reads.begin(), reads.end(), comp);

    outfile.precision(5);
    outfile << std::fixed;


    if (doc_haplotypes == 0){
        for (auto&& r : reads) {
            unsigned int abs_number_reads = r->getReadNames().size();
            outfile << ">" <<r->name;
            if (not r->single_end) outfile << "|paired";
            outfile << "|ht_freq:" << r->probability;
            outfile << "|start1:" << r->getStart1();
            outfile << "|end1:" << r->getEnd1();
            if (not r->single_end){
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            outfile << "|#reads:" << abs_number_reads;
            outfile << "|#strand:" << r->isStrand1();
            outfile << endl;

            outfile << r->sequence1;
            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    } else if(doc_haplotypes == 5) {
        std::vector<std::string> names;
        for (auto&& r : reads) {
            names = r->getReadNames();
            int haplo1counter = 0;
            int haplo2counter = 0;
            int haplo3counter = 0;
            int haplo4counter = 0;
            int haplo5counter = 0;
            outfile << ">" << r->name;

            if(r->single_end){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
            }
            else if(!r->single_end && (r->getEnd1()+1 < r->getStart2())){
                outfile << "|paired";
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            else if (!r->single_end && (r->getEnd1()+1 == r->getStart2())){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd2();
            }
            for(auto& i: names){
                 if (i.find("mutant1") != std::string::npos){
                    haplo1counter++;
                 } else if (i.find("mutant2") != std::string::npos) {
                    haplo2counter++;
                 } else if (i.find("mutant3") != std::string::npos) {
                    haplo3counter++;
                 } else if (i.find("mutant4") != std::string::npos) {
                    haplo4counter++;
                 } else if (i.find("mutant5") != std::string::npos) {
                    haplo5counter++;
                 }
            }
            outfile << "|ht1:" << haplo1counter;
            outfile << "|ht2:" << haplo2counter;
            outfile << "|ht3:" << haplo3counter;
            outfile << "|ht4:" << haplo4counter;
            outfile << "|ht5:" << haplo5counter;
            outfile << endl;

            outfile << r->sequence1;

            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    } else if(doc_haplotypes == 2){
        std::vector<std::string> names;
        for (auto&& r : reads) {
            names = r->getReadNames();
            int haplo1counter = 0;
            int haplo2counter = 0;
            outfile << ">" << r->name;

            if(r->single_end){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
            }
            else if(!r->single_end && (r->getEnd1()+1 < r->getStart2())){
                outfile << "|paired";
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            else if (!r->single_end && (r->getEnd1()+1 == r->getStart2())){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd2();
            }
            for(auto& i: names){
                 if (i.find("normal") != std::string::npos){
                    haplo1counter++;
                 } else if (i.find("mutant") != std::string::npos) {
                    haplo2counter++;
                 }
            }
            outfile << "|ht1:" << haplo1counter;
            outfile << "|ht2:" << haplo2counter;
            outfile << endl;

            outfile << r->sequence1;

            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    }
}